

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall tcu::rotationMatrix(tcu *this,float radians)

{
  float fVar1;
  float extraout_XMM0_Db;
  Matrix<float,_2,_2> MVar2;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  fVar1 = cosf(radians);
  MVar2.m_data.m_data[0].m_data[0] = sinf(radians);
  MVar2.m_data.m_data[0].m_data[1] = extraout_XMM0_Db;
  *(float *)this = fVar1;
  MVar2.m_data.m_data[1].m_data =
       (float  [2])
       (CONCAT44(extraout_XMM0_Db,MVar2.m_data.m_data[0].m_data[0]) ^ 0x8000000080000000);
  *(float *)(this + 8) = -MVar2.m_data.m_data[0].m_data[0];
  *(float *)(this + 4) = MVar2.m_data.m_data[0].m_data[0];
  *(float *)(this + 0xc) = fVar1;
  return (Matrix<float,_2,_2>)MVar2.m_data.m_data;
}

Assistant:

inline Matrix<float, 2, 2> rotationMatrix (float radians)
{
	Matrix<float, 2, 2> mat;
	float				c	= deFloatCos(radians);
	float				s	= deFloatSin(radians);

	mat(0, 0) = c;
	mat(0, 1) = -s;
	mat(1, 0) = s;
	mat(1, 1) = c;

	return mat;
}